

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O0

uint32_t duckdb::DecodeBase64Bytes<false>(string_t *str,const_data_ptr_t input_data,idx_t base_idx)

{
  uint uVar1;
  undefined8 uVar2;
  long in_RDX;
  long in_RSI;
  idx_t decode_idx;
  int decoded_bytes [4];
  string_t *in_stack_ffffffffffffff98;
  allocator local_51;
  string local_50 [16];
  unsigned_long in_stack_ffffffffffffffc0;
  uchar in_stack_ffffffffffffffcf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3 < params) {
      uVar1 = UnsafeNumericCast<unsigned_int,_int,_void>
                        (in_stack_ffffffffffffffd8 * 0x40000 + in_stack_ffffffffffffffdc * 0x1000 +
                         in_stack_ffffffffffffffe0 * 0x40 + in_stack_ffffffffffffffe4);
      return uVar1;
    }
    *(undefined4 *)(&stack0xffffffffffffffd8 + (long)params * 4) =
         *(undefined4 *)
          (BASE64_DECODING_TABLE + (ulong)(byte)(&params->_M_dataplus)[in_RSI + in_RDX] * 4);
    if (*(int *)(&stack0xffffffffffffffd8 + (long)params * 4) < 0) break;
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&params->field_0x1
    ;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_50,
             "Could not decode string \"%s\" as base64: invalid byte value \'%d\' at position %d",
             &local_51);
  string_t::GetString(in_stack_ffffffffffffff98);
  ConversionException::
  ConversionException<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_unsigned_long>
            ((ConversionException *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (string *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),params,
             in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc0);
  __cxa_throw(uVar2,&ConversionException::typeinfo,ConversionException::~ConversionException);
}

Assistant:

uint32_t DecodeBase64Bytes(const string_t &str, const_data_ptr_t input_data, idx_t base_idx) {
	int decoded_bytes[4];
	for (idx_t decode_idx = 0; decode_idx < 4; decode_idx++) {
		if (ALLOW_PADDING && decode_idx >= 2 && input_data[base_idx + decode_idx] == Blob::BASE64_PADDING) {
			// the last two bytes of a base64 string can have padding: in this case we set the byte to 0
			decoded_bytes[decode_idx] = 0;
		} else {
			decoded_bytes[decode_idx] = BASE64_DECODING_TABLE[input_data[base_idx + decode_idx]];
		}
		if (decoded_bytes[decode_idx] < 0) {
			throw ConversionException(
			    "Could not decode string \"%s\" as base64: invalid byte value '%d' at position %d", str.GetString(),
			    input_data[base_idx + decode_idx], base_idx + decode_idx);
		}
	}
	return UnsafeNumericCast<uint32_t>((decoded_bytes[0] << 3 * 6) + (decoded_bytes[1] << 2 * 6) +
	                                   (decoded_bytes[2] << 1 * 6) + (decoded_bytes[3] << 0 * 6));
}